

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O2

void __thiscall Gillespie::UpdatePropensity(Gillespie *this,Ptr *reaction)

{
  pointer pdVar1;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  _Var2;
  long lVar3;
  runtime_error *this_00;
  double extraout_XMM0_Qa;
  
  (**((reaction->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Reaction)
            ();
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Reaction>*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Reaction>const>>
                    ((this->reactions_).
                     super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->reactions_).
                     super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,reaction);
  if (_Var2._M_current ==
      (this->reactions_).
      super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (this->initialized_ == true) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Attempting to update propensity of invalid reaction.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pdVar1 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)_Var2._M_current -
            (long)(this->reactions_).
                  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 1;
    *(double *)((long)pdVar1 + lVar3) = *(double *)((long)pdVar1 + lVar3) + extraout_XMM0_Qa;
  }
  this->alpha_sum_ = extraout_XMM0_Qa + this->alpha_sum_;
  return;
}

Assistant:

void Gillespie::UpdatePropensity(Reaction::Ptr reaction) {
  // if (index >= reactions_.size() || index >= alpha_list_.size() || index < 0)
  // {
  //  throw std::range_error(
  //      "Gillespie: Reaction index out of range for propensity update.");
  // }
  // double new_prop = reactions_[index]->CalculatePropensity();
  // double diff = new_prop - alpha_list_[index];
  // alpha_sum_ += diff;
  // alpha_list_[index] = new_prop;
  double alpha_diff = reaction->CalculatePropensity();
  auto it = std::find(reactions_.begin(), reactions_.end(), reaction);
  if (it != reactions_.end()) {
    auto index = std::distance(reactions_.begin(), it);
    alpha_list_[index] += alpha_diff;
  } else {
    // Don't throw an error unless everything has been initialized
    if (initialized_ == true) {
      throw std::runtime_error(
          "Attempting to update propensity of invalid reaction.");
    }
  }
  alpha_sum_ += alpha_diff;
}